

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_time.c
# Opt level: O2

void ngx_libc_localtime(time_t s,tm *tm)

{
  time_t local_10;
  time_t s_local;
  
  local_10 = s;
  localtime_r(&local_10,(tm *)tm);
  return;
}

Assistant:

void
ngx_libc_localtime(time_t s, struct tm *tm)
{
#if (NGX_HAVE_LOCALTIME_R)
    (void) localtime_r(&s, tm);

#else
    struct tm  *t;

    t = localtime(&s);
    *tm = *t;

#endif
}